

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcStyledItem::~IfcStyledItem(IfcStyledItem *this)

{
  ~IfcStyledItem((IfcStyledItem *)&this[-1].field_0x78);
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}